

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

CreatedTransactionResult *
wallet::FundTransaction
          (CreatedTransactionResult *__return_storage_ptr__,CWallet *wallet,CMutableTransaction *tx,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
          UniValue *options,CCoinControl *coinControl,bool override_min_fee)

{
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_> *this;
  undefined **ppuVar1;
  pointer pUVar2;
  Descriptor *pDVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  string *psVar12;
  optional<OutputType> oVar13;
  _Storage<CFeeRate,_true> _Var14;
  UniValue *pUVar15;
  UniValue *pUVar16;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar17;
  string *psVar18;
  long lVar19;
  T *pTVar20;
  char *estimate_mode;
  _Array_type *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pointer pUVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  iterator __begin4;
  long *plVar24;
  pointer puVar25;
  pointer pcVar26;
  long in_FS_OFFSET;
  string_view str;
  string_view strKey;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l;
  string_view hex_str;
  string_view key;
  string_view key_00;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  size_t i_3;
  size_t i;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  CScript wit_script;
  Result<wallet::CreatedTransactionResult> txr;
  ulong local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_880;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  local_840;
  CCoinControl local_828;
  undefined1 local_658 [8];
  VectorFormatter<DefaultFormatter> *local_650;
  undefined1 local_648 [56];
  undefined1 local_610 [16];
  undefined1 local_600 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e8;
  vector<UniValue,_std::allocator<UniValue>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [32];
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  undefined1 local_478 [8];
  undefined1 auStack_470 [8];
  undefined1 local_468 [16];
  int local_458;
  undefined4 uStack_454;
  undefined1 local_450 [24];
  undefined1 auStack_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  undefined1 local_3e0 [8];
  undefined1 local_3d8 [40];
  pointer local_3b0;
  undefined1 local_3a8 [48];
  undefined1 local_378 [24];
  pointer local_360;
  undefined1 local_350 [24];
  undefined1 *local_338;
  undefined1 local_328 [16];
  undefined8 local_318;
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined8 local_2f0;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined8 local_2a0;
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined8 local_250;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined8 local_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined8 local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined8 local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined8 local_70;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_478[0] = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  estimate_mode = "FundTransaction";
  inline_check_non_fatal<bool>
            ((bool *)local_478,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp"
             ,0x1f8,"FundTransaction","tx.vout.empty()");
  CWallet::BlockUntilSyncedToCurrentChain(wallet);
  if (options->typ == VNULL) {
    bVar8 = ParseIncludeWatchonly(&NullUniValue,wallet);
LAB_00609dfe:
    coinControl->fAllowWatchOnly = bVar8;
    local_880 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_888 = 0;
    bVar8 = false;
  }
  else {
    if (options->typ == VBOOL) {
      bVar8 = ::UniValue::get_bool(options);
      goto LAB_00609dfe;
    }
    ppuVar1 = (undefined **)(auStack_470 + 8);
    local_478 = (undefined1  [8])ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"add_inputs","");
    local_458._0_1_ = false;
    local_458._1_3_ = 0;
    uStack_454 = VBOOL;
    local_450._0_8_ = (long)local_450 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"include_unsafe","");
    auStack_438._8_8_ = (pointer)0x500000000;
    local_428._0_8_ = local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"add_to_wallet","");
    local_408._0_8_ = (pointer)0x500000000;
    local_408._8_8_ = &local_3f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_408 + 8),"changeAddress","");
    local_3e0 = (undefined1  [8])0x300000000;
    local_3d8._0_8_ = local_3d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"change_address","");
    local_3d8._32_8_ = (pointer)0x300000000;
    local_3b0 = (pointer)(local_3a8 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"changePosition","");
    local_3a8._24_8_ = (pointer)0x400000000;
    local_3a8._32_8_ = local_378;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_3a8 + 0x20),"change_position","");
    local_378._16_8_ = (pointer)0x400000000;
    local_360 = (pointer)local_350;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"change_type","");
    local_350._16_8_ = 0x300000000;
    local_338 = local_328;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"includeWatching","");
    local_318 = 0x500000000;
    local_310[0] = local_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"include_watching","");
    local_2f0 = 0x500000000;
    local_2e8[0] = local_2d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"inputs","");
    local_2c8 = 0x200000000;
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"lockUnspents","");
    local_2a0 = 0x500000000;
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"lock_unspents","");
    local_278 = 0x500000000;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"locktime","");
    local_250 = 0x400000000;
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"fee_rate","");
    local_228 = 1;
    local_220[0] = local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"feeRate","");
    local_200 = 1;
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"psbt","");
    local_1d8 = 0x500000000;
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"solving_data","");
    local_1b0 = 0x100000000;
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"subtractFeeFromOutputs","")
    ;
    local_188 = 0x200000000;
    local_180[0] = local_170;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"subtract_fee_from_outputs","");
    local_160 = 0x200000000;
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"replaceable","");
    local_138 = 0x500000000;
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"conf_target","");
    local_110 = 0x400000000;
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"estimate_mode","");
    local_e8 = 0x300000000;
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"minconf","");
    local_c0 = 0x400000000;
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"maxconf","");
    local_98 = 0x400000000;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"input_weights","");
    local_70 = 0x200000000;
    plVar24 = local_58;
    local_68[0] = plVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"max_tx_weight","");
    local_48 = 0x400000000;
    psVar18 = &local_498;
    __l._M_len = 0x1b;
    __l._M_array = (iterator)local_478;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
           *)local_610,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          local_658,(allocator_type *)psVar18);
    args = (_Array_type *)0x1;
    RPCTypeCheckObj(options,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                             *)local_610,true,true);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                 *)local_610);
    lVar19 = -0x438;
    do {
      if (plVar24 != (long *)plVar24[-2]) {
        operator_delete((long *)plVar24[-2],*plVar24 + 1);
      }
      plVar24 = plVar24 + -5;
      lVar19 = lVar19 + 0x28;
    } while (lVar19 != 0);
    local_478 = (undefined1  [8])ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"add_inputs","");
    bVar8 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_610);
    if (local_478 != (undefined1  [8])ppuVar1) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar8) {
      local_478 = (undefined1  [8])ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"add_inputs","");
      pUVar16 = ::UniValue::operator[](options,(string *)local_478);
      bVar8 = ::UniValue::get_bool(pUVar16);
      coinControl->m_allow_other_inputs = bVar8;
      if (local_478 != (undefined1  [8])ppuVar1) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
    }
    local_478 = (undefined1  [8])ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"changeAddress","");
    bVar9 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_610);
    bVar8 = true;
    if (!bVar9) {
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"change_address","");
      bVar8 = ::UniValue::findKey(options,&local_498,(size_t *)local_610);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_478 != (undefined1  [8])ppuVar1) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar8 != false) {
      local_478 = (undefined1  [8])ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"change_address","");
      bVar8 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_658);
      paVar21 = &local_4b8.field_2;
      local_4b8._M_dataplus._M_p = (pointer)paVar21;
      if (bVar8) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"change_address","");
        pUVar16 = ::UniValue::operator[](options,&local_4b8);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"changeAddress","");
        pUVar16 = ::UniValue::operator[](options,&local_4b8);
      }
      psVar12 = ::UniValue::get_str_abi_cxx11_(pUVar16);
      pcVar26 = (psVar12->_M_dataplus)._M_p;
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_610,pcVar26,pcVar26 + psVar12->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != paVar21) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      if (local_478 != (undefined1  [8])ppuVar1) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      DecodeDestination((CTxDestination *)local_478,(string *)local_610);
      bVar8 = IsValidDestination((CTxDestination *)local_478);
      if (!bVar8) {
        pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
        local_658 = (undefined1  [8])local_648;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_658,"Change address must be a valid bitcoin address","");
        JSONRPCError(pUVar16,-5,(string *)local_658);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_0060da1c;
      }
      args = &std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
              ::_S_vtable;
      local_658 = (undefined1  [8])coinControl;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
        ::_S_vtable._M_arr[(long)(char)auStack_438[8] + 1]._M_data)
                ((anon_class_8_1_8991fb9c_conflict2 *)local_658,
                 (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)local_478);
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)local_478);
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
    }
    local_478 = (undefined1  [8])ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"changePosition","");
    bVar9 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_610);
    bVar8 = true;
    if (!bVar9) {
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"change_position","");
      bVar8 = ::UniValue::findKey(options,&local_4d8,(size_t *)local_610);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_478 != (undefined1  [8])ppuVar1) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar8 != false) {
      local_478 = (undefined1  [8])ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"change_position","");
      bVar8 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_610);
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
      if (bVar8) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"change_position","");
        pUVar16 = ::UniValue::operator[](options,&local_4f8);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"changePosition","");
        pUVar16 = ::UniValue::operator[](options,&local_4f8);
      }
      uVar11 = ::UniValue::getInt<int>(pUVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      if (local_478 != (undefined1  [8])ppuVar1) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      if (-1 < (int)uVar11) {
        local_880 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)uVar11;
        args = (_Array_type *)
               (((long)(recipients->
                       super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(recipients->
                       super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
        if (local_880 <= args) {
          local_888 = 0x100000000;
          goto LAB_0060a919;
        }
      }
      pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
      local_478 = (undefined1  [8])ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_478,"changePosition out of bounds","");
      JSONRPCError(pUVar16,-8,(string *)local_478);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_0060da1c;
    }
    local_880 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_888 = 0;
LAB_0060a919:
    local_478 = (undefined1  [8])ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"change_type","");
    bVar8 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_610);
    if (local_478 != (undefined1  [8])ppuVar1) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar8) {
      local_478 = (undefined1  [8])ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"changeAddress","");
      bVar9 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_610);
      bVar8 = true;
      if (!bVar9) {
        local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"change_address","");
        bVar8 = ::UniValue::findKey(options,&local_518,(size_t *)local_610);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_478 != (undefined1  [8])ppuVar1) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      if (bVar8 != false) {
        pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
        local_478 = (undefined1  [8])ppuVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_478,"Cannot specify both change address and address type options"
                   ,"");
        JSONRPCError(pUVar16,-8,(string *)local_478);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_0060da1c;
      }
      local_478 = (undefined1  [8])ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"change_type","");
      pUVar16 = ::UniValue::operator[](options,(string *)local_478);
      psVar12 = ::UniValue::get_str_abi_cxx11_(pUVar16);
      oVar13 = ParseOutputType(psVar12);
      if (local_478 != (undefined1  [8])ppuVar1) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      if (((ulong)oVar13.super__Optional_base<OutputType,_true,_true>._M_payload.
                  super__Optional_payload_base<OutputType> & 0x100000000) == 0) {
        pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
        local_610._0_8_ = local_600;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"change_type","");
        pUVar15 = ::UniValue::operator[](options,(string *)local_610);
        psVar18 = ::UniValue::get_str_abi_cxx11_(pUVar15);
        tinyformat::format<std::__cxx11::string>
                  ((string *)local_478,(tinyformat *)"Unknown change type \'%s\'",(char *)psVar18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        JSONRPCError(pUVar16,-5,(string *)local_478);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_0060da1c;
      }
      if ((coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
          super__Optional_payload_base<OutputType>._M_engaged == true) {
        (coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
        super__Optional_payload_base<OutputType>._M_engaged = false;
      }
      (coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
      super__Optional_payload_base<OutputType>._M_payload._M_value =
           oVar13.super__Optional_base<OutputType,_true,_true>._M_payload.
           super__Optional_payload_base<OutputType>._M_payload;
      (coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
      super__Optional_payload_base<OutputType>._M_engaged = true;
    }
    local_610._0_8_ = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"include_watching","");
    bVar8 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    if (bVar8) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"include_watching","");
      pUVar16 = ::UniValue::operator[](options,&local_538);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"includeWatching","");
      pUVar16 = ::UniValue::operator[](options,&local_538);
    }
    local_478._0_4_ = pUVar16->typ;
    pcVar26 = (pUVar16->val)._M_dataplus._M_p;
    auStack_470 = (undefined1  [8])(local_468 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_470,pcVar26,pcVar26 + (pUVar16->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_450,&pUVar16->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)auStack_438,&pUVar16->values);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
    }
    bVar8 = ParseIncludeWatchonly((UniValue *)local_478,wallet);
    coinControl->fAllowWatchOnly = bVar8;
    local_610._0_8_ = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"lockUnspents","");
    bVar9 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
    bVar8 = true;
    if (!bVar9) {
      local_558._M_dataplus._M_p = (pointer)((long)&local_558 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"lock_unspents","");
      bVar8 = ::UniValue::findKey(options,&local_558,(size_t *)local_658);
      if (local_558._M_dataplus._M_p != (pointer)((long)&local_558 + 0x10U)) {
        operator_delete(local_558._M_dataplus._M_p,
                        (ulong)(local_558.field_2._M_allocated_capacity + 1));
      }
    }
    if ((undefined1 *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
    }
    if (bVar8 == false) {
      bVar8 = false;
    }
    else {
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"lock_unspents","");
      bVar8 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
      local_578._0_8_ = local_578 + 0x10;
      if (bVar8) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_588 + 0x10),"lock_unspents","");
        pUVar16 = ::UniValue::operator[](options,(string *)(local_588 + 0x10));
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_588 + 0x10),"lockUnspents","");
        pUVar16 = ::UniValue::operator[](options,(string *)(local_588 + 0x10));
      }
      bVar8 = ::UniValue::get_bool(pUVar16);
      if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
        operator_delete((void *)local_578._0_8_,
                        (ulong)((long)(_Rb_tree_color *)local_578._16_8_ + 1));
      }
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
    }
    local_610._0_8_ = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"include_unsafe","");
    bVar9 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
    if ((undefined1 *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
    }
    if (bVar9) {
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"include_unsafe","");
      pUVar16 = ::UniValue::operator[](options,(string *)local_610);
      bVar9 = ::UniValue::get_bool(pUVar16);
      coinControl->m_include_unsafe_inputs = bVar9;
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
    }
    local_610._0_8_ = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"feeRate","");
    bVar9 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
    if ((undefined1 *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
    }
    if (bVar9) {
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"fee_rate","");
      bVar9 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
      if (bVar9) {
        pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
        std::operator+(&local_5b8,"Cannot specify both fee_rate (",&::CURRENCY_ATOM_abi_cxx11_);
        pbVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_5b8,"/vB) and feeRate (");
        local_598._0_8_ = (pbVar23->_M_dataplus)._M_p;
        paVar21 = &pbVar23->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._0_8_ == paVar21) {
          local_588._0_8_ = paVar21->_M_allocated_capacity;
          local_588._8_8_ = *(undefined8 *)((long)&pbVar23->field_2 + 8);
          local_598._0_8_ = (_Base_ptr)local_588;
        }
        else {
          local_588._0_8_ = paVar21->_M_allocated_capacity;
        }
        local_598._8_8_ = pbVar23->_M_string_length;
        (pbVar23->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar23->_M_string_length = 0;
        (pbVar23->field_2)._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_658,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_598,&::CURRENCY_UNIT_abi_cxx11_);
        pbVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_658,"/kvB)");
        local_610._0_8_ = (pbVar23->_M_dataplus)._M_p;
        paVar21 = &pbVar23->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610._0_8_ == paVar21) {
          local_600._0_8_ = paVar21->_M_allocated_capacity;
          local_600._8_8_ = *(long *)((long)&pbVar23->field_2 + 8);
          local_610._0_8_ = local_600;
        }
        else {
          local_600._0_8_ = paVar21->_M_allocated_capacity;
        }
        local_610._8_8_ = pbVar23->_M_string_length;
        (pbVar23->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar23->_M_string_length = 0;
        (pbVar23->field_2)._M_local_buf[0] = '\0';
        JSONRPCError(pUVar16,-8,(string *)local_610);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_0060da1c;
      }
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"conf_target","");
      bVar9 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
      if (bVar9) {
        pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
        local_610._0_8_ = local_600;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_610,
                   "Cannot specify both conf_target and feeRate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate."
                   ,"");
        JSONRPCError(pUVar16,-8,(string *)local_610);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_0060da1c;
      }
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"estimate_mode","");
      bVar9 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
      if (bVar9) {
        pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
        local_610._0_8_ = local_600;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_610,"Cannot specify both estimate_mode and feeRate","");
        JSONRPCError(pUVar16,-8,(string *)local_610);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_0060da1c;
      }
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"feeRate","");
      pUVar16 = ::UniValue::operator[](options,(string *)local_610);
      _Var14 = (_Storage<CFeeRate,_true>)AmountFromValue(pUVar16,8);
      (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_payload = _Var14;
      if ((coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
          super__Optional_payload_base<CFeeRate>._M_engaged == false) {
        (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
        super__Optional_payload_base<CFeeRate>._M_engaged = true;
      }
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
      coinControl->fOverrideFeeRate = true;
    }
    local_610._0_8_ = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"replaceable","");
    bVar9 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
    if ((undefined1 *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
    }
    if (bVar9) {
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"replaceable","");
      pUVar16 = ::UniValue::operator[](options,(string *)local_610);
      bVar9 = ::UniValue::get_bool(pUVar16);
      (coinControl->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)(bVar9 | 0x100);
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
    }
    local_610._0_8_ = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"minconf","");
    bVar9 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
    if ((undefined1 *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
    }
    if (bVar9) {
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"minconf","");
      pUVar16 = ::UniValue::operator[](options,(string *)local_610);
      iVar10 = ::UniValue::getInt<int>(pUVar16);
      coinControl->m_min_depth = iVar10;
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
      if (coinControl->m_min_depth < 0) {
        pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
        local_610._0_8_ = local_600;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"Negative minconf","");
        JSONRPCError(pUVar16,-8,(string *)local_610);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_0060da1c;
      }
    }
    local_610._0_8_ = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"maxconf","");
    bVar9 = ::UniValue::findKey(options,(string *)local_610,(size_t *)local_658);
    if ((undefined1 *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
    }
    if (bVar9) {
      local_610._0_8_ = local_600;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"maxconf","");
      pUVar16 = ::UniValue::operator[](options,(string *)local_610);
      iVar10 = ::UniValue::getInt<int>(pUVar16);
      coinControl->m_max_depth = iVar10;
      if ((undefined1 *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
      }
      if (coinControl->m_max_depth < coinControl->m_min_depth) {
        pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
        tinyformat::format<int,int>
                  ((string *)local_610,(tinyformat *)"maxconf can\'t be lower than minconf: %d < %d"
                   ,(char *)&coinControl->m_max_depth,&coinControl->m_min_depth,(int *)psVar18);
        JSONRPCError(pUVar16,-8,(string *)local_610);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
        goto LAB_0060da1c;
      }
    }
    local_610._0_8_ = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"conf_target","");
    pUVar16 = ::UniValue::operator[](options,(string *)local_610);
    local_658 = (undefined1  [8])local_648;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"estimate_mode","");
    estimate_mode = (char *)::UniValue::operator[](options,(string *)local_658);
    local_598._0_8_ = (_Base_ptr)local_588;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"fee_rate","");
    pUVar15 = ::UniValue::operator[](options,(string *)local_598);
    SetFeeEstimateMode(wallet,coinControl,pUVar16,(UniValue *)estimate_mode,pUVar15,override_min_fee
                      );
    if ((_Base_ptr)local_598._0_8_ != (_Base_ptr)local_588) {
      operator_delete((void *)local_598._0_8_,local_588._0_8_ + 1);
    }
    if (local_658 != (undefined1  [8])local_648) {
      operator_delete((void *)local_658,CONCAT71(local_648._1_7_,local_648[0]) + 1);
    }
    if ((undefined1 *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)auStack_438);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_450);
    if (auStack_470 != (undefined1  [8])(local_468 + 8)) {
      operator_delete((void *)auStack_470,local_468._8_8_ + 1);
    }
  }
  local_478 = (undefined1  [8])(auStack_470 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"solving_data","");
  bVar9 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_610);
  if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
    operator_delete((void *)local_478,local_468._0_8_ + 1);
  }
  if (bVar9) {
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"solving_data","");
    pUVar16 = ::UniValue::operator[](options,(string *)local_478);
    pUVar16 = ::UniValue::get_obj(pUVar16);
    local_610._0_4_ = pUVar16->typ;
    local_610._8_8_ = local_600 + 8;
    pcVar26 = (pUVar16->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_610 + 8),pcVar26,pcVar26 + (pUVar16->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_5e8,&pUVar16->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_5d0,&pUVar16->values);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"pubkeys","");
    bVar9 = ::UniValue::findKey((UniValue *)local_610,(string *)local_478,(size_t *)local_658);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar9) {
      local_478 = (undefined1  [8])(auStack_470 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"pubkeys","");
      pUVar16 = ::UniValue::operator[]((UniValue *)local_610,(string *)local_478);
      pUVar16 = ::UniValue::get_array(pUVar16);
      pvVar17 = ::UniValue::getValues(pUVar16);
      if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      pUVar22 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar2 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pUVar22 != pUVar2) {
        this = &(coinControl->m_external_provider).pubkeys;
        estimate_mode = (char *)this;
        do {
          psVar18 = ::UniValue::get_str_abi_cxx11_(pUVar22);
          HexToPubKey((CPubKey *)local_658,psVar18);
          CPubKey::GetID((CKeyID *)local_478,(CPubKey *)local_658);
          std::
          _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
          ::_M_emplace_unique<CKeyID,CPubKey_const&>
                    ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                      *)this,(CKeyID *)local_478,(CPubKey *)local_658);
          WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&local_5b8,(CPubKey *)local_658);
          local_468._0_4_ = local_5b8.field_2._M_allocated_capacity._0_4_;
          local_478 = (undefined1  [8])local_5b8._M_dataplus._M_p;
          auStack_470 = (undefined1  [8])local_5b8._M_string_length;
          auStack_438[8] = '\x05';
          GetScriptForDestination((CScript *)local_598,(CTxDestination *)local_478);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_478);
          CScriptID::CScriptID((CScriptID *)local_478,(CScript *)local_598);
          std::
          _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
          ::_M_emplace_unique<CScriptID,CScript_const&>
                    ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                      *)&(coinControl->m_external_provider).scripts,(CScriptID *)local_478,
                     (CScript *)local_598);
          if (0x1c < (uint)local_588._12_4_) {
            free((void *)local_598._0_8_);
            local_598._0_8_ = (_Base_ptr)0x0;
          }
          pUVar22 = pUVar22 + 1;
        } while (pUVar22 != pUVar2);
      }
    }
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"scripts","");
    bVar9 = ::UniValue::findKey((UniValue *)local_610,(string *)local_478,(size_t *)local_658);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar9) {
      local_478 = (undefined1  [8])(auStack_470 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"scripts","");
      pUVar16 = ::UniValue::operator[]((UniValue *)local_610,(string *)local_478);
      pUVar16 = ::UniValue::get_array(pUVar16);
      pvVar17 = ::UniValue::getValues(pUVar16);
      if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      pUVar22 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar2 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pUVar22 != pUVar2) {
        do {
          psVar18 = ::UniValue::get_str_abi_cxx11_(pUVar22);
          str._M_str = (psVar18->_M_dataplus)._M_p;
          str._M_len = psVar18->_M_string_length;
          bVar9 = IsHex(str);
          if (!bVar9) {
            pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<std::__cxx11::string>
                      ((string *)local_478,(tinyformat *)0x8a50d1,(char *)psVar18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       estimate_mode);
            JSONRPCError(pUVar16,-5,(string *)local_478);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
            }
            goto LAB_0060da1c;
          }
          hex_str._M_str = (psVar18->_M_dataplus)._M_p;
          hex_str._M_len = psVar18->_M_string_length;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_658,hex_str);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_478,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_658,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_650);
          CScriptID::CScriptID((CScriptID *)local_598,(CScript *)local_478);
          std::
          _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
          ::_M_emplace_unique<CScriptID,CScript_const&>
                    ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                      *)&(coinControl->m_external_provider).scripts,(CScriptID *)local_598,
                     (CScript *)local_478);
          if (0x1c < (uint)local_468._12_4_) {
            free((void *)local_478);
            local_478 = (undefined1  [8])0x0;
          }
          if (local_658 != (undefined1  [8])0x0) {
            operator_delete((void *)local_658,
                            CONCAT71(local_648._1_7_,local_648[0]) - (long)local_658);
          }
          pUVar22 = pUVar22 + 1;
        } while (pUVar22 != pUVar2);
      }
    }
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"descriptors","");
    bVar9 = ::UniValue::findKey((UniValue *)local_610,(string *)local_478,(size_t *)local_658);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    if (bVar9) {
      local_478 = (undefined1  [8])(auStack_470 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"descriptors","");
      pUVar16 = ::UniValue::operator[]((UniValue *)local_610,(string *)local_478);
      pUVar16 = ::UniValue::get_array(pUVar16);
      pvVar17 = ::UniValue::getValues(pUVar16);
      if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
        operator_delete((void *)local_478,local_468._0_8_ + 1);
      }
      pUVar22 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar2 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pUVar22 != pUVar2) {
        do {
          psVar18 = ::UniValue::get_str_abi_cxx11_(pUVar22);
          local_478 = (undefined1  [8])&PTR__FlatSigningProvider_00b409b0;
          local_468._0_8_ = local_468._0_8_ & 0xffffffff00000000;
          local_468._8_8_ = 0;
          _local_458 = (long)auStack_470 + 8;
          local_450._8_8_ = 0;
          auStack_438._0_8_ = auStack_438._0_8_ & 0xffffffff00000000;
          auStack_438._8_8_ = (pointer)0x0;
          local_428._0_8_ = auStack_438;
          local_418._0_8_ = 0;
          local_408._0_8_ = local_408._0_8_ & 0xffffffff00000000;
          local_408._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_408._16_8_ = local_408;
          local_3f0._8_8_ = 0;
          local_3d8._0_8_ = local_3d8._0_8_ & 0xffffffff00000000;
          local_3d8._8_8_ = (_Base_ptr)0x0;
          local_3d8._16_8_ = local_3d8;
          local_3d8._32_8_ = (pointer)0x0;
          local_3a8._0_4_ = _S_red;
          local_3a8._8_8_ = (_Base_ptr)0x0;
          local_3a8._16_8_ = local_3a8;
          local_3a8._32_8_ = (pointer)0x0;
          local_650 = (VectorFormatter<DefaultFormatter> *)0x0;
          local_648[0] = '\0';
          local_5b8.field_2._M_allocated_capacity = 0;
          local_5b8._M_dataplus._M_p = (pointer)0x0;
          local_5b8._M_string_length = 0;
          pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          local_658 = (undefined1  [8])local_648;
          local_450._0_8_ = _local_458;
          local_428._8_8_ = local_428._0_8_;
          local_3f0._M_allocated_capacity = local_408._16_8_;
          local_3d8._24_8_ = local_3d8._16_8_;
          local_3a8._24_8_ = local_3a8._16_8_;
          Parse(&local_840,psVar18,(FlatSigningProvider *)local_478,(string *)local_658,true);
          puVar5 = local_840.
                   super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          puVar25 = local_840.
                    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_840.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_840.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)local_598,(tinyformat *)"Unable to parse descriptor \'%s\': %s",
                       (char *)psVar18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_658,pbVar23);
            JSONRPCError(pUVar16,-8,(string *)local_598);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
            }
            goto LAB_0060da1c;
          }
          do {
            pDVar3 = (puVar25->_M_t).
                     super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
                     super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                     super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl;
            (*pDVar3->_vptr_Descriptor[8])
                      (pDVar3,0,(FlatSigningProvider *)local_478,&local_5b8,
                       (FlatSigningProvider *)local_478,0);
            puVar25 = puVar25 + 1;
          } while (puVar25 != puVar5);
          FlatSigningProvider::Merge
                    (&coinControl->m_external_provider,(FlatSigningProvider *)local_478);
          std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::~vector(&local_840);
          std::vector<CScript,_std::allocator<CScript>_>::~vector
                    ((vector<CScript,_std::allocator<CScript>_> *)&local_5b8);
          if (local_658 != (undefined1  [8])local_648) {
            operator_delete((void *)local_658,CONCAT71(local_648._1_7_,local_648[0]) + 1);
          }
          std::
          _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
          ::~_Rb_tree((_Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                       *)&local_3b0);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                       *)local_3e0);
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                       *)(local_418 + 8));
          std::
          _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                       *)(local_450 + 0x10));
          std::
          _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
          ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                       *)auStack_470);
          pUVar22 = pUVar22 + 1;
        } while (pUVar22 != pUVar2);
      }
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5e8);
    if ((undefined1 *)local_610._8_8_ != local_600 + 8) {
      operator_delete((void *)local_610._8_8_,(ulong)(local_600._8_8_ + 1));
    }
  }
  local_478 = (undefined1  [8])(auStack_470 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"input_weights","");
  bVar9 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_610);
  if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
    operator_delete((void *)local_478,local_468._0_8_ + 1);
  }
  if (bVar9) {
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"input_weights","");
    pUVar16 = ::UniValue::operator[](options,(string *)local_478);
    pUVar16 = ::UniValue::get_array(pUVar16);
    pvVar17 = ::UniValue::getValues(pUVar16);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    pUVar22 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pUVar2 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pUVar22 != pUVar2) {
      do {
        strKey._M_str = "txid";
        strKey._M_len = 4;
        ParseHashO((uint256 *)local_610,pUVar22,strKey);
        key._M_str = "vout";
        key._M_len = 4;
        pUVar16 = ::UniValue::find_value(pUVar22,key);
        if (pUVar16->typ != VNUM) {
          pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
          local_478 = (undefined1  [8])(auStack_470 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,"Invalid parameter, missing vout key","");
          JSONRPCError(pUVar16,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_0060da1c;
        }
        iVar10 = ::UniValue::getInt<int>(pUVar16);
        if (iVar10 < 0) {
          pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
          local_478 = (undefined1  [8])(auStack_470 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,"Invalid parameter, vout cannot be negative","");
          JSONRPCError(pUVar16,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_0060da1c;
        }
        key_00._M_str = "weight";
        key_00._M_len = 6;
        pUVar16 = ::UniValue::find_value(pUVar22,key_00);
        if (pUVar16->typ != VNUM) {
          pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
          local_478 = (undefined1  [8])(auStack_470 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,"Invalid parameter, missing weight key","");
          JSONRPCError(pUVar16,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_0060da1c;
        }
        lVar19 = ::UniValue::getInt<long>(pUVar16);
        local_468._0_8_ = 0;
        local_468._8_8_ = 0;
        local_478 = (undefined1  [8])0x0;
        auStack_470 = (undefined1  [8])0x0;
        local_458 = 0xffffffff;
        local_450._16_8_ = 0;
        auStack_438._0_8_ = 0;
        local_450[0] = false;
        local_450._1_3_ = 0;
        local_450._4_4_ = VNULL;
        local_450._8_8_ = 0;
        local_418._0_8_ = 0;
        local_428._0_8_ = (pointer)0x0;
        local_428._8_8_ = (pointer)0x0;
        auStack_438._8_4_ = 0xffffffff;
        local_658 = (undefined1  [8])&::TX_NO_WITNESS;
        local_598._0_8_ = (_Base_ptr)0x24;
        local_650 = (VectorFormatter<DefaultFormatter> *)local_598;
        SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
                  ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_658,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_450);
        *(long *)local_650 = *(long *)local_650 + 4;
        uVar6 = local_598._0_8_;
        local_658 = (undefined1  [8])&::TX_WITH_WITNESS;
        local_598._0_8_ = (_Base_ptr)0x24;
        local_650 = (VectorFormatter<DefaultFormatter> *)local_598;
        SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
                  ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_658,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_450);
        *(long *)local_650 = *(long *)local_650 + 4;
        uVar7 = local_598._0_8_;
        local_658 = (undefined1  [8])0x0;
        VectorFormatter<DefaultFormatter>::
        Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((VectorFormatter<DefaultFormatter> *)local_598,(SizeComputer *)local_658,
                   (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_428);
        pcVar26 = (pointer)(uVar7 + uVar6 * 3) + (long)local_658;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_428);
        if (0x1c < (uint)auStack_438._4_4_) {
          free((void *)local_450._0_8_);
          local_450[0] = false;
          local_450._1_3_ = 0;
          local_450._4_4_ = VNULL;
        }
        local_478[0] = pcVar26 == (pointer)0xa5;
        inline_check_non_fatal<bool>
                  ((bool *)local_478,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/spend.cpp"
                   ,0x2b7,"FundTransaction","min_input_weight == 165");
        if (lVar19 < (long)pcVar26) {
          pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
          local_478 = (undefined1  [8])(auStack_470 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_478,
                     "Invalid parameter, weight cannot be less than 165 (41 bytes (size of outpoint + sequence + empty scriptSig) * 4 (witness scaling factor)) + 1 (empty witness)"
                     ,"");
          JSONRPCError(pUVar16,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_0060da1c;
        }
        if (400000 < lVar19) {
          pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
          tinyformat::format<int>
                    ((string *)local_478,
                     "Invalid parameter, weight cannot be greater than the maximum standard tx weight of %d"
                     ,&MAX_STANDARD_TX_WEIGHT);
          JSONRPCError(pUVar16,-8,(string *)local_478);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
          }
          goto LAB_0060da1c;
        }
        local_468._0_8_ = local_600._0_8_;
        local_468._8_8_ = local_600._8_8_;
        local_478 = (undefined1  [8])local_610._0_8_;
        auStack_470 = (undefined1  [8])local_610._8_8_;
        local_458 = iVar10;
        CCoinControl::SetInputWeight(coinControl,(COutPoint *)local_478,lVar19);
        pUVar22 = pUVar22 + 1;
      } while (pUVar22 != pUVar2);
    }
  }
  local_478 = (undefined1  [8])(auStack_470 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"max_tx_weight","");
  bVar9 = ::UniValue::findKey(options,(string *)local_478,(size_t *)local_610);
  if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
    operator_delete((void *)local_478,local_468._0_8_ + 1);
  }
  if (bVar9) {
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"max_tx_weight","");
    pUVar16 = ::UniValue::operator[](options,(string *)local_478);
    uVar11 = ::UniValue::getInt<int>(pUVar16);
    (coinControl->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> = (_Optional_payload_base<int>)((ulong)uVar11 | 0x100000000);
    if (local_478 != (undefined1  [8])(auStack_470 + 8)) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
  }
  if ((recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
    local_478 = (undefined1  [8])(auStack_470 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_478,"TX must have at least one output","");
    JSONRPCError(pUVar16,-8,(string *)local_478);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
  }
  else {
    _GLOBAL__N_1::std::__detail::__variant::
    _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_828,
                      (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)coinControl);
    local_828.m_min_depth = coinControl->m_min_depth;
    local_828.m_max_depth = coinControl->m_max_depth;
    local_828.m_change_type.super__Optional_base<OutputType,_true,_true>._M_payload.
    super__Optional_payload_base<OutputType> =
         *(_Optional_base<OutputType,_true,_true> *)
          &(coinControl->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
           super__Optional_payload_base<OutputType>;
    local_828.m_include_unsafe_inputs = coinControl->m_include_unsafe_inputs;
    local_828.m_allow_other_inputs = coinControl->m_allow_other_inputs;
    local_828.fAllowWatchOnly = coinControl->fAllowWatchOnly;
    local_828.fOverrideFeeRate = coinControl->fOverrideFeeRate;
    local_828._92_4_ = *(undefined4 *)&coinControl->field_0x5c;
    local_828.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload =
         (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
         super__Optional_payload_base<CFeeRate>._M_payload;
    local_828.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_engaged =
         (coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
         super__Optional_payload_base<CFeeRate>._M_engaged;
    local_828.m_feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._9_7_ =
         *(undefined7 *)
          &(coinControl->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
           super__Optional_payload_base<CFeeRate>.field_0x9;
    local_828.m_confirm_target.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         *(_Optional_base<unsigned_int,_true,_true> *)
          &(coinControl->m_confirm_target).super__Optional_base<unsigned_int,_true,_true>._M_payload
           .super__Optional_payload_base<unsigned_int>;
    local_828.m_signal_bip125_rbf.super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         (coinControl->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>;
    local_828.m_avoid_partial_spends = coinControl->m_avoid_partial_spends;
    local_828.m_avoid_address_reuse = coinControl->m_avoid_address_reuse;
    local_828.m_fee_mode = coinControl->m_fee_mode;
    FlatSigningProvider::FlatSigningProvider
              (&local_828.m_external_provider,&coinControl->m_external_provider);
    local_828.m_max_tx_weight.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> =
         *(_Optional_base<int,_true,_true> *)
          &(coinControl->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>;
    local_828.m_locktime.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         *(_Optional_base<unsigned_int,_true,_true> *)
          &(coinControl->m_locktime).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
    local_828.m_version.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         *(_Optional_base<unsigned_int,_true,_true> *)
          &(coinControl->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
    ::_Rb_tree(&local_828.m_selected._M_t,&(coinControl->m_selected)._M_t);
    local_828.m_selection_pos = coinControl->m_selection_pos;
    FundTransaction((Result<wallet::CreatedTransactionResult> *)local_478,wallet,tx,recipients,
                    (optional<unsigned_int>)(local_888 | (ulong)local_880),bVar8,&local_828);
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
    ::~_Rb_tree(&local_828.m_selected._M_t);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&local_828.m_external_provider.tr_trees._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_828.m_external_provider.keys._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&local_828.m_external_provider.origins._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&local_828.m_external_provider.pubkeys._M_t);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&local_828.m_external_provider.scripts._M_t);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_828);
    if (local_3d8[0] == (string)0x1) {
      pTVar20 = util::Result<wallet::CreatedTransactionResult>::value
                          ((Result<wallet::CreatedTransactionResult> *)local_478);
      (__return_storage_ptr__->tx).
      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pTVar20->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = (pTVar20->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (__return_storage_ptr__->tx).
      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      memcpy(&__return_storage_ptr__->fee,&pTVar20->fee,0x90);
      _GLOBAL__N_1::std::__detail::__variant::
      _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                 local_478);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
    }
    else {
      pUVar16 = (UniValue *)__cxa_allocate_exception(0x58);
      util::ErrorString<wallet::CreatedTransactionResult>
                ((bilingual_str *)local_610,(Result<wallet::CreatedTransactionResult> *)local_478);
      JSONRPCError(pUVar16,-4,(string *)local_610);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar16,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
    }
  }
LAB_0060da1c:
  __stack_chk_fail();
}

Assistant:

CreatedTransactionResult FundTransaction(CWallet& wallet, const CMutableTransaction& tx, const std::vector<CRecipient>& recipients, const UniValue& options, CCoinControl& coinControl, bool override_min_fee)
{
    // We want to make sure tx.vout is not used now that we are passing outputs as a vector of recipients.
    // This sets us up to remove tx completely in a future PR in favor of passing the inputs directly.
    CHECK_NONFATAL(tx.vout.empty());
    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    std::optional<unsigned int> change_position;
    bool lockUnspents = false;
    if (!options.isNull()) {
      if (options.type() == UniValue::VBOOL) {
        // backward compatibility bool only fallback
        coinControl.fAllowWatchOnly = options.get_bool();
      }
      else {
        RPCTypeCheckObj(options,
            {
                {"add_inputs", UniValueType(UniValue::VBOOL)},
                {"include_unsafe", UniValueType(UniValue::VBOOL)},
                {"add_to_wallet", UniValueType(UniValue::VBOOL)},
                {"changeAddress", UniValueType(UniValue::VSTR)},
                {"change_address", UniValueType(UniValue::VSTR)},
                {"changePosition", UniValueType(UniValue::VNUM)},
                {"change_position", UniValueType(UniValue::VNUM)},
                {"change_type", UniValueType(UniValue::VSTR)},
                {"includeWatching", UniValueType(UniValue::VBOOL)},
                {"include_watching", UniValueType(UniValue::VBOOL)},
                {"inputs", UniValueType(UniValue::VARR)},
                {"lockUnspents", UniValueType(UniValue::VBOOL)},
                {"lock_unspents", UniValueType(UniValue::VBOOL)},
                {"locktime", UniValueType(UniValue::VNUM)},
                {"fee_rate", UniValueType()}, // will be checked by AmountFromValue() in SetFeeEstimateMode()
                {"feeRate", UniValueType()}, // will be checked by AmountFromValue() below
                {"psbt", UniValueType(UniValue::VBOOL)},
                {"solving_data", UniValueType(UniValue::VOBJ)},
                {"subtractFeeFromOutputs", UniValueType(UniValue::VARR)},
                {"subtract_fee_from_outputs", UniValueType(UniValue::VARR)},
                {"replaceable", UniValueType(UniValue::VBOOL)},
                {"conf_target", UniValueType(UniValue::VNUM)},
                {"estimate_mode", UniValueType(UniValue::VSTR)},
                {"minconf", UniValueType(UniValue::VNUM)},
                {"maxconf", UniValueType(UniValue::VNUM)},
                {"input_weights", UniValueType(UniValue::VARR)},
                {"max_tx_weight", UniValueType(UniValue::VNUM)},
            },
            true, true);

        if (options.exists("add_inputs")) {
            coinControl.m_allow_other_inputs = options["add_inputs"].get_bool();
        }

        if (options.exists("changeAddress") || options.exists("change_address")) {
            const std::string change_address_str = (options.exists("change_address") ? options["change_address"] : options["changeAddress"]).get_str();
            CTxDestination dest = DecodeDestination(change_address_str);

            if (!IsValidDestination(dest)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Change address must be a valid bitcoin address");
            }

            coinControl.destChange = dest;
        }

        if (options.exists("changePosition") || options.exists("change_position")) {
            int pos = (options.exists("change_position") ? options["change_position"] : options["changePosition"]).getInt<int>();
            if (pos < 0 || (unsigned int)pos > recipients.size()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "changePosition out of bounds");
            }
            change_position = (unsigned int)pos;
        }

        if (options.exists("change_type")) {
            if (options.exists("changeAddress") || options.exists("change_address")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both change address and address type options");
            }
            if (std::optional<OutputType> parsed = ParseOutputType(options["change_type"].get_str())) {
                coinControl.m_change_type.emplace(parsed.value());
            } else {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Unknown change type '%s'", options["change_type"].get_str()));
            }
        }

        const UniValue include_watching_option = options.exists("include_watching") ? options["include_watching"] : options["includeWatching"];
        coinControl.fAllowWatchOnly = ParseIncludeWatchonly(include_watching_option, wallet);

        if (options.exists("lockUnspents") || options.exists("lock_unspents")) {
            lockUnspents = (options.exists("lock_unspents") ? options["lock_unspents"] : options["lockUnspents"]).get_bool();
        }

        if (options.exists("include_unsafe")) {
            coinControl.m_include_unsafe_inputs = options["include_unsafe"].get_bool();
        }

        if (options.exists("feeRate")) {
            if (options.exists("fee_rate")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both fee_rate (" + CURRENCY_ATOM + "/vB) and feeRate (" + CURRENCY_UNIT + "/kvB)");
            }
            if (options.exists("conf_target")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both conf_target and feeRate. Please provide either a confirmation target in blocks for automatic fee estimation, or an explicit fee rate.");
            }
            if (options.exists("estimate_mode")) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot specify both estimate_mode and feeRate");
            }
            coinControl.m_feerate = CFeeRate(AmountFromValue(options["feeRate"]));
            coinControl.fOverrideFeeRate = true;
        }

        if (options.exists("replaceable")) {
            coinControl.m_signal_bip125_rbf = options["replaceable"].get_bool();
        }

        if (options.exists("minconf")) {
            coinControl.m_min_depth = options["minconf"].getInt<int>();

            if (coinControl.m_min_depth < 0) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative minconf");
            }
        }

        if (options.exists("maxconf")) {
            coinControl.m_max_depth = options["maxconf"].getInt<int>();

            if (coinControl.m_max_depth < coinControl.m_min_depth) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("maxconf can't be lower than minconf: %d < %d", coinControl.m_max_depth, coinControl.m_min_depth));
            }
        }
        SetFeeEstimateMode(wallet, coinControl, options["conf_target"], options["estimate_mode"], options["fee_rate"], override_min_fee);
      }
    } else {
        // if options is null and not a bool
        coinControl.fAllowWatchOnly = ParseIncludeWatchonly(NullUniValue, wallet);
    }

    if (options.exists("solving_data")) {
        const UniValue solving_data = options["solving_data"].get_obj();
        if (solving_data.exists("pubkeys")) {
            for (const UniValue& pk_univ : solving_data["pubkeys"].get_array().getValues()) {
                const CPubKey pubkey = HexToPubKey(pk_univ.get_str());
                coinControl.m_external_provider.pubkeys.emplace(pubkey.GetID(), pubkey);
                // Add witness script for pubkeys
                const CScript wit_script = GetScriptForDestination(WitnessV0KeyHash(pubkey));
                coinControl.m_external_provider.scripts.emplace(CScriptID(wit_script), wit_script);
            }
        }

        if (solving_data.exists("scripts")) {
            for (const UniValue& script_univ : solving_data["scripts"].get_array().getValues()) {
                const std::string& script_str = script_univ.get_str();
                if (!IsHex(script_str)) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("'%s' is not hex", script_str));
                }
                std::vector<unsigned char> script_data(ParseHex(script_str));
                const CScript script(script_data.begin(), script_data.end());
                coinControl.m_external_provider.scripts.emplace(CScriptID(script), script);
            }
        }

        if (solving_data.exists("descriptors")) {
            for (const UniValue& desc_univ : solving_data["descriptors"].get_array().getValues()) {
                const std::string& desc_str  = desc_univ.get_str();
                FlatSigningProvider desc_out;
                std::string error;
                std::vector<CScript> scripts_temp;
                auto descs = Parse(desc_str, desc_out, error, true);
                if (descs.empty()) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Unable to parse descriptor '%s': %s", desc_str, error));
                }
                for (auto& desc : descs) {
                    desc->Expand(0, desc_out, scripts_temp, desc_out);
                }
                coinControl.m_external_provider.Merge(std::move(desc_out));
            }
        }
    }

    if (options.exists("input_weights")) {
        for (const UniValue& input : options["input_weights"].get_array().getValues()) {
            Txid txid = Txid::FromUint256(ParseHashO(input, "txid"));

            const UniValue& vout_v = input.find_value("vout");
            if (!vout_v.isNum()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing vout key");
            }
            int vout = vout_v.getInt<int>();
            if (vout < 0) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout cannot be negative");
            }

            const UniValue& weight_v = input.find_value("weight");
            if (!weight_v.isNum()) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing weight key");
            }
            int64_t weight = weight_v.getInt<int64_t>();
            const int64_t min_input_weight = GetTransactionInputWeight(CTxIn());
            CHECK_NONFATAL(min_input_weight == 165);
            if (weight < min_input_weight) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, weight cannot be less than 165 (41 bytes (size of outpoint + sequence + empty scriptSig) * 4 (witness scaling factor)) + 1 (empty witness)");
            }
            if (weight > MAX_STANDARD_TX_WEIGHT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, weight cannot be greater than the maximum standard tx weight of %d", MAX_STANDARD_TX_WEIGHT));
            }

            coinControl.SetInputWeight(COutPoint(txid, vout), weight);
        }
    }

    if (options.exists("max_tx_weight")) {
        coinControl.m_max_tx_weight = options["max_tx_weight"].getInt<int>();
    }

    if (recipients.empty())
        throw JSONRPCError(RPC_INVALID_PARAMETER, "TX must have at least one output");

    auto txr = FundTransaction(wallet, tx, recipients, change_position, lockUnspents, coinControl);
    if (!txr) {
        throw JSONRPCError(RPC_WALLET_ERROR, ErrorString(txr).original);
    }
    return *txr;
}